

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_basic_string<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_RDI;
  context<toml::type_config> *in_stack_000000a0;
  location *in_stack_000000a8;
  type reg;
  type val;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  val_res;
  string_format_info fmt;
  location first;
  region *in_stack_fffffffffffffb68;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_stack_fffffffffffffb70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  location *in_stack_fffffffffffffb88;
  location *in_stack_fffffffffffffb90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *this_00;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  *in_stack_fffffffffffffbc8;
  source_location in_stack_fffffffffffffbd0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbd8;
  string_type *in_stack_fffffffffffffbe0;
  basic_value<toml::type_config> *in_stack_fffffffffffffbe8;
  string_format_info in_stack_fffffffffffffbf6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d8;
  string_format_info local_3ba;
  basic_value<toml::type_config> *in_stack_fffffffffffffc58;
  undefined1 local_200 [152];
  undefined **local_168;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  local_f8;
  string_format_info local_62 [49];
  
  this_00 = in_RDI;
  location::location(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  string_format_info::string_format_info(local_62);
  local_62[0] = (string_format_info)((ushort)local_62[0].start_with_newline << 8);
  parse_basic_string_only<toml::type_config>(in_stack_000000a8,in_stack_000000a0);
  bVar1 = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
          ::is_err(&local_f8);
  if (bVar1) {
    local_168 = &PTR_s__workspace_llm4binary_github_lic_00933010;
    result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
    ::unwrap_err(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbd0);
    err<toml::error_info>((error_info *)in_stack_fffffffffffffbc8);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_fffffffffffffb70,(failure_type *)in_stack_fffffffffffffb68);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x67ef3b);
    local_200._148_4_ = 1;
  }
  else {
    local_200._104_8_ = &PTR_s__workspace_llm4binary_github_lic_00933028;
    result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
    ::unwrap(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbd0);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               in_stack_fffffffffffffba8);
    result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
    ::unwrap(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbd0);
    in_stack_fffffffffffffb70 =
         (result<toml::basic_value<toml::type_config>,_toml::error_info> *)local_200;
    region::region((region *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               in_stack_fffffffffffffba8);
    local_3ba = local_62[0];
    local_3d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = &local_3d8;
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x67f079);
    region::region((region *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    basic_value<toml::type_config>::basic_value
              (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbf6,
               in_stack_fffffffffffffbd8,(region_type *)in_stack_fffffffffffffbd0._M_impl);
    ok<toml::basic_value<toml::type_config>>(in_stack_fffffffffffffc58);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_fffffffffffffb70,(success_type *)in_stack_fffffffffffffb68);
    success<toml::basic_value<toml::type_config>_>::~success
              ((success<toml::basic_value<toml::type_config>_> *)0x67f0eb);
    basic_value<toml::type_config>::~basic_value
              ((basic_value<toml::type_config> *)in_stack_fffffffffffffb70);
    region::~region((region *)in_stack_fffffffffffffb70);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb70);
    local_200._148_4_ = 1;
    region::~region((region *)in_stack_fffffffffffffb70);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb70);
  }
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  ::~result((result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
             *)0x67f206);
  location::~location((location *)in_stack_fffffffffffffb70);
  return in_RDI;
}

Assistant:

result<basic_value<TC>, error_info>
parse_basic_string(location& loc, const context<TC>& ctx)
{
    const auto first = loc;

    string_format_info fmt;
    fmt.fmt = string_format::basic;

    auto val_res = parse_basic_string_only(loc, ctx);
    if(val_res.is_err())
    {
        return err(std::move(val_res.unwrap_err()));
    }
    auto val = std::move(val_res.unwrap().first );
    auto reg = std::move(val_res.unwrap().second);

    return ok(basic_value<TC>(std::move(val), std::move(fmt), {}, std::move(reg)));
}